

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O1

int coda_product_type_add_product_definition
              (coda_product_type *product_type,coda_product_definition *product_definition)

{
  int iVar1;
  coda_product_definition **ppcVar2;
  long lVar3;
  
  if (product_definition->product_type == (coda_product_type_struct *)0x0) {
    if (0 < (long)product_type->num_product_definitions) {
      lVar3 = 0;
      do {
        if (product_type->product_definition[lVar3]->version == product_definition->version) {
          coda_set_error(-400,
                         "multiple product definitions with version number %d for product type %s",
                         (ulong)(uint)product_definition->version,product_type->name);
          return -1;
        }
        lVar3 = lVar3 + 1;
      } while (product_type->num_product_definitions != lVar3);
    }
    iVar1 = coda_hashtable_add_name(product_type->hash_data,product_definition->name);
    if (iVar1 == 0) {
      if (((long)product_type->num_product_definitions & 0xfU) == 0) {
        ppcVar2 = (coda_product_definition **)
                  realloc(product_type->product_definition,
                          (long)product_type->num_product_definitions * 8 + 0x80);
        if (ppcVar2 == (coda_product_definition **)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                         (long)product_type->num_product_definitions * 8 + 0x80,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                         ,0x23e);
          return -1;
        }
        product_type->product_definition = ppcVar2;
      }
      iVar1 = product_type->num_product_definitions;
      product_type->num_product_definitions = iVar1 + 1;
      product_type->product_definition[iVar1] = product_definition;
      product_definition->product_type = product_type;
      return 0;
    }
    coda_set_error(-400,"duplicate product definition %s for product type %s",
                   product_definition->name,product_type->name);
  }
  else {
    coda_set_error(-400,
                   "product definition %s can not be used by more than one product type (%s and %s)"
                   ,product_definition->name,product_definition->product_type->name,
                   product_type->name);
  }
  return -1;
}

Assistant:

int coda_product_type_add_product_definition(coda_product_type *product_type,
                                             coda_product_definition *product_definition)
{
    int i;

    if (product_definition->product_type != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product definition %s can not be used by more than one product "
                       "type (%s and %s)", product_definition->name, product_definition->product_type->name,
                       product_type->name);
        return -1;
    }
    for (i = 0; i < product_type->num_product_definitions; i++)
    {
        if (product_type->product_definition[i]->version == product_definition->version)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "multiple product definitions with version number %d for "
                           "product type %s", product_definition->version, product_type->name);
            return -1;
        }
    }
    if (hashtable_add_name(product_type->hash_data, product_definition->name) != 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "duplicate product definition %s for product type %s",
                       product_definition->name, product_type->name);
        return -1;
    }
    if (product_type->num_product_definitions % BLOCK_SIZE == 0)
    {
        coda_product_definition **new_product_definition;

        new_product_definition = realloc(product_type->product_definition,
                                         (product_type->num_product_definitions + BLOCK_SIZE) *
                                         sizeof(coda_product_definition *));
        if (new_product_definition == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (product_type->num_product_definitions + BLOCK_SIZE) *
                           sizeof(coda_product_definition *), __FILE__, __LINE__);
            return -1;
        }
        product_type->product_definition = new_product_definition;
    }
    product_type->num_product_definitions++;
    product_type->product_definition[product_type->num_product_definitions - 1] = product_definition;

    product_definition->product_type = product_type;

    return 0;
}